

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationRuleParser::parseTailoringString
          (CollationRuleParser *this,int32_t i,UnicodeString *raw,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UErrorCode *errorCode_local;
  UnicodeString *raw_local;
  int32_t i_local;
  CollationRuleParser *this_local;
  
  iVar2 = skipWhiteSpace(this,i);
  iVar2 = parseString(this,iVar2,raw,errorCode);
  UVar1 = ::U_SUCCESS(*errorCode);
  if (UVar1 != '\0') {
    UVar1 = UnicodeString::isEmpty(raw);
    if (UVar1 != '\0') {
      setParseError(this,"missing relation string",errorCode);
    }
  }
  iVar2 = skipWhiteSpace(this,iVar2);
  return iVar2;
}

Assistant:

int32_t
CollationRuleParser::parseTailoringString(int32_t i, UnicodeString &raw, UErrorCode &errorCode) {
    i = parseString(skipWhiteSpace(i), raw, errorCode);
    if(U_SUCCESS(errorCode) && raw.isEmpty()) {
        setParseError("missing relation string", errorCode);
    }
    return skipWhiteSpace(i);
}